

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void setReadOp(ReadOp *readOp,string *argument,bool *overrideFile,string *feature)

{
  int iVar1;
  ReadOp RVar2;
  string operation;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::substr((ulong)local_48,(ulong)argument);
  iVar1 = std::__cxx11::string::compare((char *)local_48);
  if (iVar1 == 0) {
    RVar2 = BackupSuffix;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_48);
    if (iVar1 == 0) {
      RVar2 = BackupPrefix;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_48);
      if (iVar1 == 0) {
        RVar2 = InputFiles;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_48);
        if (iVar1 == 0) {
          *overrideFile = false;
          RVar2 = Unspecified;
        }
        else {
          RVar2 = Unspecified;
          std::__cxx11::string::_M_assign((string *)feature);
        }
      }
    }
  }
  *readOp = RVar2;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void setReadOp(ReadOp &readOp, std::string &argument, bool &overrideFile, std::string &feature) {

    std::string operation = argument.substr(1, argument.size() - 1); // Remove the '-'

    if (operation == "suf") {
        readOp = BackupSuffix;
    } else if (operation == "pre") {
        readOp = BackupPrefix;
    } else if (operation == "i") {
        readOp = InputFiles;
    } else if (operation == "b") {
        overrideFile = false;
        readOp = Unspecified;
    } else {
        feature = operation;
        readOp = Unspecified;
    }
}